

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> * __thiscall
pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
          (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this,
          vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *other)

{
  size_t sVar1;
  Half *pHVar2;
  Half *pHVar3;
  size_t sVar4;
  
  if (this != other) {
    this->nStored = 0;
    reserve(this,other->nStored);
    sVar1 = other->nStored;
    if (sVar1 != 0) {
      pHVar2 = this->ptr;
      pHVar3 = other->ptr;
      sVar4 = 0;
      do {
        pHVar2[sVar4].h = pHVar3[sVar4].h;
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
    }
    this->nStored = sVar1;
  }
  return this;
}

Assistant:

vector &operator=(const vector &other) {
        if (this == &other)
            return *this;

        clear();
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();

        return *this;
    }